

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_queue.c
# Opt level: O0

ngx_queue_t * ngx_queue_middle(ngx_queue_t *queue)

{
  ngx_queue_t *local_28;
  ngx_queue_t *next;
  ngx_queue_t *middle;
  ngx_queue_t *queue_local;
  
  next = queue->next;
  queue_local = next;
  if (next != queue->prev) {
    local_28 = queue->next;
    do {
      next = next->next;
      if (local_28->next == queue->prev) {
        return next;
      }
      local_28 = local_28->next->next;
      queue_local = next;
    } while (local_28 != queue->prev);
  }
  return queue_local;
}

Assistant:

ngx_queue_t *
ngx_queue_middle(ngx_queue_t *queue)
{
    ngx_queue_t  *middle, *next;

    middle = ngx_queue_head(queue);

    if (middle == ngx_queue_last(queue)) {
        return middle;
    }

    next = ngx_queue_head(queue);

    for ( ;; ) {
        middle = ngx_queue_next(middle);

        next = ngx_queue_next(next);

        if (next == ngx_queue_last(queue)) {
            return middle;
        }

        next = ngx_queue_next(next);

        if (next == ngx_queue_last(queue)) {
            return middle;
        }
    }
}